

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_low8_ssse3(__m128i *input,__m128i *output)

{
  int32_t *cospi;
  int8_t cos_bit;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  __m128i __rounding;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d0;
  longlong local_4c8;
  longlong lStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 uStack_430;
  longlong local_428;
  longlong lStack_420;
  longlong local_418;
  longlong lStack_410;
  longlong local_408;
  longlong lStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  longlong local_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong local_3c8;
  longlong lStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [16];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  longlong lVar1;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  undefined1 auVar29 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  
  auVar67 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar8 = auVar67._0_4_;
  auVar78._4_4_ = uVar8;
  auVar78._0_4_ = uVar8;
  auVar78._8_4_ = uVar8;
  auVar78._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  auVar68._0_4_ = auVar67._0_4_;
  auVar68._4_4_ = auVar68._0_4_;
  auVar68._8_4_ = auVar68._0_4_;
  auVar68._12_4_ = auVar68._0_4_;
  auVar79 = pmulhrsw(auVar78,(undefined1  [16])input[1]);
  auVar69 = pmulhrsw(auVar68,(undefined1  [16])input[1]);
  auVar67 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar8 = auVar67._0_4_;
  auVar89._4_4_ = uVar8;
  auVar89._0_4_ = uVar8;
  auVar89._8_4_ = uVar8;
  auVar89._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  auVar63._0_4_ = auVar67._0_4_;
  auVar63._4_4_ = auVar63._0_4_;
  auVar63._8_4_ = auVar63._0_4_;
  auVar63._12_4_ = auVar63._0_4_;
  auVar90 = pmulhrsw(auVar89,(undefined1  [16])input[7]);
  auVar64 = pmulhrsw(auVar63,(undefined1  [16])input[7]);
  auVar67 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar8 = auVar67._0_4_;
  auVar97._4_4_ = uVar8;
  auVar97._0_4_ = uVar8;
  auVar97._8_4_ = uVar8;
  auVar97._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  auVar55._0_4_ = auVar67._0_4_;
  auVar55._4_4_ = auVar55._0_4_;
  auVar55._8_4_ = auVar55._0_4_;
  auVar55._12_4_ = auVar55._0_4_;
  auVar98 = pmulhrsw(auVar97,(undefined1  [16])input[5]);
  auVar56 = pmulhrsw(auVar55,(undefined1  [16])input[5]);
  auVar67 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar8 = auVar67._0_4_;
  auVar106._4_4_ = uVar8;
  auVar106._0_4_ = uVar8;
  auVar106._8_4_ = uVar8;
  auVar106._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  auVar47._0_4_ = auVar67._0_4_;
  auVar47._4_4_ = auVar47._0_4_;
  auVar47._8_4_ = auVar47._0_4_;
  auVar47._12_4_ = auVar47._0_4_;
  local_138 = pmulhrsw(auVar106,(undefined1  [16])input[3]);
  auVar48 = pmulhrsw(auVar47,(undefined1  [16])input[3]);
  auVar67 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar8 = auVar67._0_4_;
  auVar96._4_4_ = uVar8;
  auVar96._0_4_ = uVar8;
  auVar96._8_4_ = uVar8;
  auVar96._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar8 = auVar67._0_4_;
  auVar104._4_4_ = uVar8;
  auVar104._0_4_ = uVar8;
  auVar104._8_4_ = uVar8;
  auVar104._12_4_ = uVar8;
  local_328 = pmulhrsw(auVar96,(undefined1  [16])input[2]);
  auVar105 = pmulhrsw(auVar104,(undefined1  [16])input[2]);
  auVar67 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar8 = auVar67._0_4_;
  auVar31._4_4_ = uVar8;
  auVar31._0_4_ = uVar8;
  auVar31._8_4_ = uVar8;
  auVar31._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  auVar20._0_4_ = auVar67._0_4_;
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  local_2b8 = pmulhrsw(auVar31,(undefined1  [16])input[6]);
  auVar21 = pmulhrsw(auVar20,(undefined1  [16])input[6]);
  auVar67 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar8 = auVar67._0_4_;
  auVar22._4_4_ = uVar8;
  auVar22._0_4_ = uVar8;
  auVar22._8_4_ = uVar8;
  auVar22._12_4_ = uVar8;
  auVar67 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar76._0_4_ = auVar67._0_4_;
  auVar76._4_4_ = auVar76._0_4_;
  auVar76._8_4_ = auVar76._0_4_;
  auVar76._12_4_ = auVar76._0_4_;
  auVar23 = pmulhrsw(auVar22,(undefined1  [16])input[4]);
  auVar9 = pmulhrsw(auVar76,(undefined1  [16])input[4]);
  auVar83._0_12_ = auVar79._0_12_;
  auVar83._12_2_ = auVar79._6_2_;
  auVar83._14_2_ = auVar69._6_2_;
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._0_10_ = auVar79._0_10_;
  auVar82._10_2_ = auVar69._4_2_;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._0_8_ = auVar79._0_8_;
  auVar81._8_2_ = auVar79._4_2_;
  auVar80._8_8_ = auVar81._8_8_;
  auVar80._6_2_ = auVar69._2_2_;
  auVar80._4_2_ = auVar79._2_2_;
  auVar80._0_2_ = auVar79._0_2_;
  auVar80._2_2_ = auVar69._0_2_;
  auVar67._2_2_ = auVar69._8_2_;
  auVar67._0_2_ = auVar79._8_2_;
  auVar67._4_2_ = auVar79._10_2_;
  auVar67._6_2_ = auVar69._10_2_;
  auVar67._8_2_ = auVar79._12_2_;
  auVar67._10_2_ = auVar69._12_2_;
  auVar67._12_2_ = auVar79._14_2_;
  auVar67._14_2_ = auVar69._14_2_;
  auVar86._8_4_ = 0x191f014;
  auVar86._0_8_ = 0x191f0140191f014;
  auVar86._12_4_ = 0x191f014;
  auVar32 = pmaddwd(auVar80,auVar86);
  auVar10 = pmaddwd(auVar86,auVar67);
  auVar24._8_4_ = 0xfec0191;
  auVar24._0_8_ = 0xfec01910fec0191;
  auVar24._12_4_ = 0xfec0191;
  auVar84 = pmaddwd(auVar80,auVar24);
  auVar67 = pmaddwd(auVar67,auVar24);
  auVar33._0_4_ = auVar32._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar32._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar32._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar32._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar34 = packssdw(auVar33,auVar11);
  auVar85._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  auVar86 = packssdw(auVar85,auVar10);
  auVar73._0_12_ = auVar90._0_12_;
  auVar73._12_2_ = auVar90._6_2_;
  auVar73._14_2_ = auVar64._6_2_;
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._0_10_ = auVar90._0_10_;
  auVar72._10_2_ = auVar64._4_2_;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._0_8_ = auVar90._0_8_;
  auVar71._8_2_ = auVar90._4_2_;
  auVar70._8_8_ = auVar71._8_8_;
  auVar70._6_2_ = auVar64._2_2_;
  auVar70._4_2_ = auVar90._2_2_;
  auVar70._0_2_ = auVar90._0_2_;
  auVar70._2_2_ = auVar64._0_2_;
  auVar32._2_2_ = auVar64._8_2_;
  auVar32._0_2_ = auVar90._8_2_;
  auVar32._4_2_ = auVar90._10_2_;
  auVar32._6_2_ = auVar64._10_2_;
  auVar32._8_2_ = auVar90._12_2_;
  auVar32._10_2_ = auVar64._12_2_;
  auVar32._12_2_ = auVar90._14_2_;
  auVar32._14_2_ = auVar64._14_2_;
  auVar12._8_4_ = 0xf5daf3a2;
  auVar12._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar12._12_4_ = 0xf5daf3a2;
  auVar84 = pmaddwd(auVar70,auVar12);
  auVar10 = pmaddwd(auVar12,auVar32);
  auVar25._8_4_ = 0xc5ef5da;
  auVar25._0_8_ = 0xc5ef5da0c5ef5da;
  auVar25._12_4_ = 0xc5ef5da;
  auVar74 = pmaddwd(auVar70,auVar25);
  auVar67 = pmaddwd(auVar32,auVar25);
  auVar35._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar13._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar32 = packssdw(auVar35,auVar13);
  auVar75._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar75._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar75._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar75._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  auVar84._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  auVar76 = packssdw(auVar75,auVar84);
  auVar112._0_12_ = auVar98._0_12_;
  auVar112._12_2_ = auVar98._6_2_;
  auVar112._14_2_ = auVar56._6_2_;
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._0_10_ = auVar98._0_10_;
  auVar111._10_2_ = auVar56._4_2_;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._0_8_ = auVar98._0_8_;
  auVar110._8_2_ = auVar98._4_2_;
  auVar109._8_8_ = auVar110._8_8_;
  auVar109._6_2_ = auVar56._2_2_;
  auVar109._4_2_ = auVar98._2_2_;
  auVar109._0_2_ = auVar98._0_2_;
  auVar109._2_2_ = auVar56._0_2_;
  auVar74._2_2_ = auVar56._8_2_;
  auVar74._0_2_ = auVar98._8_2_;
  auVar74._4_2_ = auVar98._10_2_;
  auVar74._6_2_ = auVar56._10_2_;
  auVar74._8_2_ = auVar98._12_2_;
  auVar74._10_2_ = auVar56._12_2_;
  auVar74._12_2_ = auVar98._14_2_;
  auVar74._14_2_ = auVar56._14_2_;
  auVar14._8_4_ = 0x78bf1e4;
  auVar14._0_8_ = 0x78bf1e4078bf1e4;
  auVar14._12_4_ = 0x78bf1e4;
  auVar84 = pmaddwd(auVar109,auVar14);
  auVar10 = pmaddwd(auVar14,auVar74);
  auVar26._8_4_ = 0xe1c078b;
  auVar26._0_8_ = 0xe1c078b0e1c078b;
  auVar26._12_4_ = 0xe1c078b;
  auVar113 = pmaddwd(auVar109,auVar26);
  auVar67 = pmaddwd(auVar74,auVar26);
  auVar36._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar15._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar84 = packssdw(auVar36,auVar15);
  auVar114._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar113._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar114,auVar113);
  auVar102._0_12_ = local_138._0_12_;
  auVar102._12_2_ = local_138._6_2_;
  auVar102._14_2_ = auVar48._6_2_;
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._0_10_ = local_138._0_10_;
  auVar101._10_2_ = auVar48._4_2_;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._0_8_ = local_138._0_8_;
  auVar100._8_2_ = local_138._4_2_;
  auVar99._8_8_ = auVar100._8_8_;
  auVar99._6_2_ = auVar48._2_2_;
  auVar99._4_2_ = local_138._2_2_;
  auVar99._0_2_ = local_138._0_2_;
  auVar99._2_2_ = auVar48._0_2_;
  auVar65._2_2_ = auVar48._8_2_;
  auVar65._0_2_ = local_138._8_2_;
  auVar65._4_2_ = local_138._10_2_;
  auVar65._6_2_ = auVar48._10_2_;
  auVar65._8_2_ = local_138._12_2_;
  auVar65._10_2_ = auVar48._12_2_;
  auVar65._12_2_ = local_138._14_2_;
  auVar65._14_2_ = auVar48._14_2_;
  auVar16._8_4_ = 0xfb5bf0b0;
  auVar16._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar16._12_4_ = 0xfb5bf0b0;
  auVar113 = pmaddwd(auVar99,auVar16);
  auVar10 = pmaddwd(auVar16,auVar65);
  auVar27._8_4_ = 0xf50fb5b;
  auVar27._0_8_ = 0xf50fb5b0f50fb5b;
  auVar27._12_4_ = 0xf50fb5b;
  auVar74 = pmaddwd(auVar99,auVar27);
  auVar67 = pmaddwd(auVar65,auVar27);
  auVar108._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar108._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar108._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar108._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_158 = packssdw(auVar108,auVar17);
  auVar103._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar103._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar103._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar103._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  auVar2._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar2._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar2._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar2._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  local_118 = packssdw(auVar103,auVar2);
  auVar94._0_12_ = local_328._0_12_;
  auVar94._12_2_ = local_328._6_2_;
  auVar94._14_2_ = auVar105._6_2_;
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._0_10_ = local_328._0_10_;
  auVar93._10_2_ = auVar105._4_2_;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._0_8_ = local_328._0_8_;
  auVar92._8_2_ = local_328._4_2_;
  auVar91._8_8_ = auVar92._8_8_;
  auVar91._6_2_ = auVar105._2_2_;
  auVar91._4_2_ = local_328._2_2_;
  auVar91._0_2_ = local_328._0_2_;
  auVar91._2_2_ = auVar105._0_2_;
  auVar3._2_2_ = auVar105._8_2_;
  auVar3._0_2_ = local_328._8_2_;
  auVar3._4_2_ = local_328._10_2_;
  auVar3._6_2_ = auVar105._10_2_;
  auVar3._8_2_ = local_328._12_2_;
  auVar3._10_2_ = auVar105._12_2_;
  auVar3._12_2_ = local_328._14_2_;
  auVar3._14_2_ = auVar105._14_2_;
  auVar18._8_4_ = 0x31ff04f;
  auVar18._0_8_ = 0x31ff04f031ff04f;
  auVar18._12_4_ = 0x31ff04f;
  auVar74 = pmaddwd(auVar91,auVar18);
  auVar10 = pmaddwd(auVar18,auVar3);
  auVar49._8_4_ = 0xfb1031f;
  auVar49._0_8_ = 0xfb1031f0fb1031f;
  auVar49._12_4_ = 0xfb1031f;
  auVar113 = pmaddwd(auVar91,auVar49);
  auVar67 = pmaddwd(auVar3,auVar49);
  auVar37._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  auVar19._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar10 = packssdw(auVar37,auVar19);
  auVar95._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar95._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar95._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar95._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar4._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar4._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar4._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar4._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  local_258 = packssdw(auVar95,auVar4);
  local_538._0_2_ = auVar21._0_2_;
  local_538._2_2_ = auVar21._2_2_;
  local_538._4_2_ = auVar21._4_2_;
  local_538._6_2_ = auVar21._6_2_;
  uStack_530._0_2_ = auVar21._8_2_;
  uStack_530._2_2_ = auVar21._10_2_;
  uStack_530._4_2_ = auVar21._12_2_;
  uStack_530._6_2_ = auVar21._14_2_;
  auVar60._0_12_ = local_2b8._0_12_;
  auVar60._12_2_ = local_2b8._6_2_;
  auVar60._14_2_ = local_538._6_2_;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = local_2b8._0_10_;
  auVar59._10_2_ = local_538._4_2_;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = local_2b8._0_8_;
  auVar58._8_2_ = local_2b8._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = local_538._2_2_;
  auVar57._4_2_ = local_2b8._2_2_;
  auVar57._0_2_ = local_2b8._0_2_;
  auVar57._2_2_ = (undefined2)local_538;
  auVar50._2_2_ = (undefined2)uStack_530;
  auVar50._0_2_ = local_2b8._8_2_;
  auVar50._4_2_ = local_2b8._10_2_;
  auVar50._6_2_ = uStack_530._2_2_;
  auVar50._8_2_ = local_2b8._12_2_;
  auVar50._10_2_ = uStack_530._4_2_;
  auVar50._12_2_ = local_2b8._14_2_;
  auVar50._14_2_ = uStack_530._6_2_;
  auVar5._8_4_ = 0xf71cf2b2;
  auVar5._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar5._12_4_ = 0xf71cf2b2;
  auVar65 = pmaddwd(auVar57,auVar5);
  auVar67 = pmaddwd(auVar5,auVar50);
  auVar107._8_4_ = 0xd4ef71c;
  auVar107._0_8_ = 0xd4ef71c0d4ef71c;
  auVar107._12_4_ = 0xd4ef71c;
  auVar113 = pmaddwd(auVar57,auVar107);
  auVar74 = pmaddwd(auVar50,auVar107);
  auVar66._0_4_ = auVar65._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar65._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar65._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar65._12_4_ + 0x800 >> 0xc;
  auVar6._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  local_2d8 = packssdw(auVar66,auVar6);
  auVar61._0_4_ = auVar113._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar113._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar113._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar113._12_4_ + 0x800 >> 0xc;
  auVar51._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  local_298 = packssdw(auVar61,auVar51);
  auVar67 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar7._0_4_ = auVar67._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar67 = pmulhrsw(auVar7,(undefined1  [16])*input);
  uStack_430 = auVar79._8_8_;
  uStack_220 = uStack_430;
  local_4f8 = auVar69._0_8_;
  uStack_4f0 = auVar69._8_8_;
  local_38 = local_4f8;
  uStack_30 = uStack_4f0;
  uStack_450 = auVar90._8_8_;
  uStack_1b0 = uStack_450;
  local_568 = auVar64._0_8_;
  uStack_560 = auVar64._8_8_;
  local_a8 = local_568;
  uStack_a0 = uStack_560;
  uStack_490 = auVar98._8_8_;
  uStack_1a0 = uStack_490;
  local_488 = auVar56._0_8_;
  uStack_480 = auVar56._8_8_;
  local_b8 = local_488;
  uStack_b0 = uStack_480;
  local_4b8 = auVar48._0_8_;
  uStack_4b0 = auVar48._8_8_;
  local_128 = local_4b8;
  uStack_120 = uStack_4b0;
  local_558 = auVar105._0_8_;
  uStack_550 = auVar105._8_8_;
  local_238 = local_558;
  uStack_230 = uStack_550;
  local_2a8 = (undefined2)local_538;
  uStack_2a6 = local_538._2_2_;
  uStack_2a4 = local_538._4_2_;
  uStack_2a2 = local_538._6_2_;
  uStack_2a0 = (undefined2)uStack_530;
  uStack_29e = uStack_530._2_2_;
  uStack_29c = uStack_530._4_2_;
  uStack_29a = uStack_530._6_2_;
  local_508 = auVar23._0_8_;
  uStack_500 = auVar23._8_8_;
  local_3a8 = local_508;
  uStack_3a0 = uStack_500;
  local_4e8 = auVar9._0_8_;
  uStack_4e0 = auVar9._8_8_;
  local_338 = local_4e8;
  uStack_330 = uStack_4e0;
  local_448 = auVar34._0_8_;
  uStack_440 = auVar34._8_8_;
  local_218 = local_448;
  uStack_210 = uStack_440;
  local_518 = auVar86._0_8_;
  uStack_510 = auVar86._8_8_;
  local_48 = local_518;
  uStack_40 = uStack_510;
  local_468 = auVar32._0_8_;
  uStack_460 = auVar32._8_8_;
  local_1c8 = local_468;
  uStack_1c0 = uStack_460;
  local_478 = auVar76._0_8_;
  uStack_470 = auVar76._8_8_;
  local_98 = local_478;
  uStack_90 = uStack_470;
  local_4a8 = auVar84._0_8_;
  uStack_4a0 = auVar84._8_8_;
  local_198 = local_4a8;
  uStack_190 = uStack_4a0;
  local_578 = auVar10._0_8_;
  uStack_570 = auVar10._8_8_;
  local_318 = local_578;
  uStack_310 = uStack_570;
  uStack_1f0 = uStack_430;
  local_208 = local_448;
  uStack_200 = uStack_440;
  uStack_1e0 = uStack_450;
  local_1d8 = local_468;
  uStack_1d0 = uStack_460;
  uStack_170 = uStack_490;
  local_188 = local_4a8;
  uStack_180 = uStack_4a0;
  uStack_4d0 = local_138._8_8_;
  uStack_160 = uStack_4d0;
  local_f8 = local_4b8;
  uStack_f0 = uStack_4b0;
  local_e8 = local_488;
  uStack_e0 = uStack_480;
  local_78 = local_568;
  uStack_70 = uStack_560;
  local_88 = local_478;
  uStack_80 = uStack_470;
  cos_bit = '8';
  local_68 = local_4f8;
  uStack_60 = uStack_4f0;
  local_58 = local_518;
  uStack_50 = uStack_510;
  local_4c8 = auVar67._0_8_;
  lStack_4c0 = auVar67._8_8_;
  local_428 = local_4c8;
  lStack_420 = lStack_4c0;
  local_418 = local_4c8;
  lStack_410 = lStack_4c0;
  local_4e8._0_2_ = auVar9._0_2_;
  local_4e8._2_2_ = auVar9._2_2_;
  local_4e8._4_2_ = auVar9._4_2_;
  local_4e8._6_2_ = auVar9._6_2_;
  uStack_4e0._0_2_ = auVar9._8_2_;
  uStack_4e0._2_2_ = auVar9._10_2_;
  uStack_4e0._4_2_ = auVar9._12_2_;
  uStack_4e0._6_2_ = auVar9._14_2_;
  auVar41._0_12_ = auVar23._0_12_;
  auVar41._12_2_ = auVar23._6_2_;
  auVar41._14_2_ = local_4e8._6_2_;
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = auVar23._0_10_;
  auVar40._10_2_ = local_4e8._4_2_;
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._8_2_ = auVar23._4_2_;
  auVar39._0_8_ = local_508;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._6_2_ = local_4e8._2_2_;
  auVar38._4_2_ = auVar23._2_2_;
  auVar38._0_2_ = auVar23._0_2_;
  auVar38._2_2_ = (undefined2)local_4e8;
  auVar87._2_2_ = (undefined2)uStack_4e0;
  auVar87._0_2_ = auVar23._8_2_;
  auVar87._4_2_ = auVar23._10_2_;
  auVar87._6_2_ = uStack_4e0._2_2_;
  auVar87._8_2_ = auVar23._12_2_;
  auVar87._10_2_ = uStack_4e0._4_2_;
  auVar87._12_2_ = auVar23._14_2_;
  auVar87._14_2_ = uStack_4e0._6_2_;
  auVar9._8_4_ = 0x61ff138;
  auVar9._0_8_ = 0x61ff138061ff138;
  auVar9._12_4_ = 0x61ff138;
  auVar32 = pmaddwd(auVar38,auVar9);
  auVar67 = pmaddwd(auVar9,auVar87);
  auVar77._8_4_ = 0xec8061f;
  auVar77._0_8_ = 0xec8061f0ec8061f;
  auVar77._12_4_ = 0xec8061f;
  auVar10 = pmaddwd(auVar38,auVar77);
  auVar84 = pmaddwd(auVar87,auVar77);
  auVar52._0_4_ = auVar32._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar32._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar32._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar32._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  local_398 = packssdw(auVar52,auVar23);
  auVar42._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar88._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar88._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar88._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar88._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  local_348 = packssdw(auVar42,auVar88);
  uStack_540 = local_328._8_8_;
  uStack_2f0 = uStack_540;
  local_308 = local_578;
  uStack_300 = uStack_570;
  uStack_520 = local_2b8._8_8_;
  uStack_2e0 = uStack_520;
  local_538 = auVar21._0_8_;
  uStack_530 = auVar21._8_8_;
  local_278 = local_538;
  uStack_270 = uStack_530;
  local_268 = local_558;
  uStack_260 = uStack_550;
  cospi = (int32_t *)0xf4b0;
  __rounding[1]._0_4_ = 0x61ff138;
  __rounding[0] = 0xb50;
  __rounding[1]._4_4_ = 0;
  lVar1 = 0x61ff138;
  local_2f8 = auVar92._0_8_;
  local_2e8 = auVar58._0_8_;
  local_2c8 = local_2d8;
  local_288 = local_298;
  local_248 = local_258;
  local_228 = auVar81._0_8_;
  local_1f8 = auVar81._0_8_;
  local_1e8 = auVar71._0_8_;
  local_1b8 = auVar71._0_8_;
  local_1a8 = auVar110._0_8_;
  local_178 = auVar110._0_8_;
  local_168 = auVar100._0_8_;
  local_148 = local_158;
  local_108 = local_118;
  local_c8 = local_d8;
  idct64_stage6_high32_sse2((__m128i *)&local_428,(int32_t *)0xf4b0,__rounding,'8');
  local_3f8 = local_428;
  lStack_3f0 = lStack_420;
  local_408 = local_418;
  lStack_400 = lStack_410;
  local_378._8_8_ = uStack_3a0;
  local_378._0_8_ = local_3a8;
  local_388 = local_398;
  local_368._8_8_ = uStack_330;
  local_368._0_8_ = local_338;
  local_358 = local_348;
  __rounding_00[1] = lVar1;
  __rounding_00[0] = extraout_RDX;
  idct64_stage7_high48_sse2((__m128i *)&local_428,cospi,__rounding_00,cos_bit);
  local_3b8 = local_428;
  lStack_3b0 = lStack_420;
  local_3c8 = local_418;
  lStack_3c0 = lStack_410;
  local_3d8 = local_408;
  lStack_3d0 = lStack_400;
  local_3e8 = local_3f8;
  lStack_3e0 = lStack_3f0;
  auVar56._0_12_ = local_388._0_12_;
  auVar56._12_2_ = local_388._6_2_;
  auVar56._14_2_ = local_358._6_2_;
  auVar64._12_4_ = auVar56._12_4_;
  auVar64._0_10_ = local_388._0_10_;
  auVar64._10_2_ = local_358._4_2_;
  auVar69._10_6_ = auVar64._10_6_;
  auVar69._0_8_ = local_388._0_8_;
  auVar69._8_2_ = local_388._4_2_;
  auVar79._8_8_ = auVar69._8_8_;
  auVar79._6_2_ = local_358._2_2_;
  auVar79._4_2_ = local_388._2_2_;
  auVar79._0_2_ = local_388._0_2_;
  auVar79._2_2_ = local_358._0_2_;
  auVar43._2_2_ = local_358._8_2_;
  auVar43._0_2_ = local_388._8_2_;
  auVar43._4_2_ = local_388._10_2_;
  auVar43._6_2_ = local_358._10_2_;
  auVar43._8_2_ = local_388._12_2_;
  auVar43._10_2_ = local_358._12_2_;
  auVar43._12_2_ = local_388._14_2_;
  auVar43._14_2_ = local_358._14_2_;
  auVar21._8_4_ = 0xb50f4b0;
  auVar21._0_8_ = 0xb50f4b00b50f4b0;
  auVar21._12_4_ = 0xb50f4b0;
  auVar32 = pmaddwd(auVar79,auVar21);
  auVar84 = pmaddwd(auVar43,auVar21);
  auVar48._8_4_ = 0xb500b50;
  auVar48._0_8_ = 0xb500b500b500b50;
  auVar48._12_4_ = 0xb500b50;
  auVar67 = pmaddwd(auVar79,auVar48);
  auVar10 = pmaddwd(auVar43,auVar48);
  auVar53._0_4_ = auVar32._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar32._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar32._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar32._12_4_ + 0x800 >> 0xc;
  auVar62._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  local_388 = packssdw(auVar53,auVar62);
  auVar90._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_358 = packssdw(auVar90,auVar44);
  auVar29._0_12_ = local_378._0_12_;
  auVar29._12_2_ = local_378._6_2_;
  auVar29._14_2_ = local_368._6_2_;
  auVar28._12_4_ = auVar29._12_4_;
  auVar28._0_10_ = local_378._0_10_;
  auVar28._10_2_ = local_368._4_2_;
  auVar105._10_6_ = auVar28._10_6_;
  auVar105._0_8_ = local_378._0_8_;
  auVar105._8_2_ = local_378._4_2_;
  auVar98._8_8_ = auVar105._8_8_;
  auVar98._6_2_ = local_368._2_2_;
  auVar98._4_2_ = local_378._2_2_;
  auVar98._0_2_ = local_378._0_2_;
  auVar98._2_2_ = local_368._0_2_;
  auVar45._2_2_ = local_368._8_2_;
  auVar45._0_2_ = local_378._8_2_;
  auVar45._4_2_ = local_378._10_2_;
  auVar45._6_2_ = local_368._10_2_;
  auVar45._8_2_ = local_378._12_2_;
  auVar45._10_2_ = local_368._12_2_;
  auVar45._12_2_ = local_378._14_2_;
  auVar45._14_2_ = local_368._14_2_;
  auVar84 = pmaddwd(auVar98,auVar21);
  auVar67 = pmaddwd(auVar21,auVar45);
  auVar10 = pmaddwd(auVar98,auVar48);
  auVar32 = pmaddwd(auVar45,auVar48);
  auVar54._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar34._0_4_ = auVar67._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar67._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar67._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar67._12_4_ + 0x800 >> 0xc;
  local_378 = packssdw(auVar54,auVar34);
  auVar30._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar46._0_4_ = auVar32._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar32._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar32._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar32._12_4_ + 0x800 >> 0xc;
  local_368 = packssdw(auVar30,auVar46);
  __rounding_01[1] = lVar1;
  __rounding_01[0] = extraout_RDX_00;
  idct64_stage8_high48_sse2((__m128i *)&local_428,cospi,__rounding_01,cos_bit);
  __rounding_02[1] = lVar1;
  __rounding_02[0] = extraout_RDX_01;
  idct64_stage9_sse2((__m128i *)&local_428,cospi,__rounding_02,cos_bit);
  __rounding_03[1] = lVar1;
  __rounding_03[0] = extraout_RDX_02;
  idct64_stage10_sse2((__m128i *)&local_428,cospi,__rounding_03,cos_bit);
  idct64_stage11_sse2(output,(__m128i *)&local_428);
  return;
}

Assistant:

static void idct64_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  const __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  const __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  const __m128i cospi_m28_m36 = pair_set_epi16(-cospi[28], -cospi[36]);
  const __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  const __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  const __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);
  const __m128i cospi_m12_m52 = pair_set_epi16(-cospi[12], -cospi[52]);
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  const __m128i cospi_m24_m40 = pair_set_epi16(-cospi[24], -cospi[40]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[8] = input[4];
  x[16] = input[2];
  x[24] = input[6];
  x[32] = input[1];
  x[40] = input[5];
  x[48] = input[3];
  x[56] = input[7];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[38] = x[39];
  x[41] = x[40];
  x[46] = x[47];
  x[49] = x[48];
  x[54] = x[55];
  x[57] = x[56];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  x[17] = x[16];
  x[22] = x[23];
  x[25] = x[24];
  x[30] = x[31];
  btf_16_sse2(cospi_m04_p60, cospi_p60_p04, x[33], x[62], x[33], x[62]);
  btf_16_sse2(cospi_m28_m36, cospi_m36_p28, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m20_p44, cospi_p44_p20, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m12_m52, cospi_m52_p12, x[46], x[49], x[46], x[49]);

  // stage 5
  x[9] = x[8];
  x[14] = x[15];
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[22], x[25], x[22], x[25]);
  x[35] = x[32];
  x[34] = x[33];
  x[36] = x[39];
  x[37] = x[38];
  x[43] = x[40];
  x[42] = x[41];
  x[44] = x[47];
  x[45] = x[46];
  x[51] = x[48];
  x[50] = x[49];
  x[52] = x[55];
  x[53] = x[54];
  x[59] = x[56];
  x[58] = x[57];
  x[60] = x[63];
  x[61] = x[62];

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  x[19] = x[16];
  x[18] = x[17];
  x[20] = x[23];
  x[21] = x[22];
  x[27] = x[24];
  x[26] = x[25];
  x[28] = x[31];
  x[29] = x[30];
  idct64_stage6_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  x[11] = x[8];
  x[10] = x[9];
  x[12] = x[15];
  x[13] = x[14];
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  x[7] = x[0];
  x[6] = x[1];
  x[5] = x[2];
  x[4] = x[3];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}